

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,StringRef error)

{
  ColourImpl *pCVar1;
  TablePrinter *pTVar2;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  uStack_28 = in_RAX;
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,2,error.m_size);
  pTVar2 = (this->m_tablePrinter).m_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((pTVar2->m_oss).m_oss,"Benchmark failed (",0x12);
  std::ostream::write((char *)(pTVar2->m_oss).m_oss,(long)error.m_start);
  uStack_28._0_7_ = CONCAT16(0x29,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((pTVar2->m_oss).m_oss,(char *)((long)&uStack_28 + 6),1);
  operator<<(pTVar2);
  if (0 < pTVar2->m_currentColumn) {
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (pTVar2->m_os,(char *)((long)&uStack_28 + 7),1);
    pTVar2->m_currentColumn = -1;
  }
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed( StringRef error ) {
    auto guard = m_colour->guardColour( Colour::Red ).engage( m_stream );
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}